

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O2

void __thiscall Assimp::XFileExporter::WriteNode(XFileExporter *this,aiNode *pNode)

{
  string *psVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  char *this_00;
  aiMatrix4x4 m;
  void *local_1d8;
  ulong local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),"Node_");
    std::ostream::_M_insert<void_const*>(poVar2);
    std::__cxx11::stringbuf::str();
    if (local_1d0 < 0x400) {
      (pNode->mName).length = (ai_uint32)local_1d0;
      memcpy((pNode->mName).data,local_1d8,local_1d0);
      (pNode->mName).data[local_1d0] = '\0';
    }
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  poVar2 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  this_00 = "Frame ";
  poVar2 = std::operator<<(poVar2,"Frame ");
  toXFileString_abi_cxx11_((string *)local_1b8,(XFileExporter *)this_00,&pNode->mName);
  poVar2 = std::operator<<(poVar2,(string *)local_1b8);
  poVar2 = std::operator<<(poVar2," {");
  psVar1 = &this->endstr;
  std::operator<<(poVar2,(string *)psVar1);
  std::__cxx11::string::~string((string *)local_1b8);
  PushTag(this);
  local_1b8._0_8_ = *(undefined8 *)&pNode->mTransformation;
  local_1b8._8_4_ = (pNode->mTransformation).a3;
  local_1b8._12_4_ = (pNode->mTransformation).a4;
  local_1a8[0]._0_4_ = (pNode->mTransformation).b1;
  local_1a8[0]._4_4_ = (pNode->mTransformation).b2;
  local_1a8[0]._8_4_ = (pNode->mTransformation).b3;
  local_1a8[0]._12_4_ = (pNode->mTransformation).b4;
  local_1a8[1]._0_4_ = (pNode->mTransformation).c1;
  local_1a8[1]._4_4_ = (pNode->mTransformation).c2;
  local_1a8[1]._8_4_ = (pNode->mTransformation).c3;
  local_1a8[1]._12_4_ = (pNode->mTransformation).c4;
  local_1a8[2]._0_4_ = (pNode->mTransformation).d1;
  local_1a8[2]._4_4_ = (pNode->mTransformation).d2;
  local_1a8[2]._8_4_ = (pNode->mTransformation).d3;
  local_1a8[2]._12_4_ = (pNode->mTransformation).d4;
  WriteFrameTransform(this,(aiMatrix4x4 *)local_1b8);
  for (uVar3 = 0; uVar3 < pNode->mNumMeshes; uVar3 = uVar3 + 1) {
    WriteMesh(this,this->mScene->mMeshes[pNode->mMeshes[uVar3]]);
  }
  for (uVar3 = 0; uVar3 < pNode->mNumChildren; uVar3 = uVar3 + 1) {
    WriteNode(this,pNode->mChildren[uVar3]);
  }
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  std::operator<<(poVar2,(string *)psVar1);
  return;
}

Assistant:

void XFileExporter::WriteNode( aiNode* pNode)
{
    if (pNode->mName.length==0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }
    mOutput << startstr << "Frame " << toXFileString(pNode->mName) << " {" << endstr;

    PushTag();

    aiMatrix4x4 m = pNode->mTransformation;

    WriteFrameTransform(m);

    for (size_t i = 0; i < pNode->mNumMeshes; ++i)
        WriteMesh(mScene->mMeshes[pNode->mMeshes[i]]);

    // recursive call the Nodes
    for (size_t i = 0; i < pNode->mNumChildren; ++i)
        WriteNode(pNode->mChildren[i]);

    PopTag();

    mOutput << startstr << "}" << endstr << endstr;
}